

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O1

void __thiscall FPolyObj::UnLinkPolyobj(FPolyObj *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  polyblock_t *ppVar7;
  
  lVar4 = (long)this->bbox[1];
  iVar1 = this->bbox[0];
  if (this->bbox[1] <= iVar1) {
    lVar5 = (long)bmapwidth;
    iVar2 = this->bbox[2];
    iVar3 = this->bbox[3];
    do {
      if (iVar2 <= iVar3) {
        lVar6 = (long)iVar2;
        do {
          if ((((-1 < lVar6) && (-1 < lVar4)) && (lVar6 < lVar5)) && (lVar4 < bmapheight)) {
            for (ppVar7 = PolyBlockMap[lVar6 + lVar4 * lVar5]; ppVar7 != (polyblock_t *)0x0;
                ppVar7 = ppVar7->next) {
              if (ppVar7->polyobj == this) {
                ppVar7->polyobj = (FPolyObj *)0x0;
                break;
              }
            }
          }
          lVar6 = lVar6 + 1;
        } while (iVar3 + 1 != (int)lVar6);
      }
      lVar4 = lVar4 + 1;
    } while (iVar1 + 1 != (int)lVar4);
  }
  return;
}

Assistant:

void FPolyObj::UnLinkPolyobj ()
{
	polyblock_t *link;
	int i, j;
	int index;

	// remove the polyobj from each blockmap section
	for(j = bbox[BOXBOTTOM]; j <= bbox[BOXTOP]; j++)
	{
		index = j*bmapwidth;
		for(i = bbox[BOXLEFT]; i <= bbox[BOXRIGHT]; i++)
		{
			if(i >= 0 && i < bmapwidth && j >= 0 && j < bmapheight)
			{
				link = PolyBlockMap[index+i];
				while(link != NULL && link->polyobj != this)
				{
					link = link->next;
				}
				if(link == NULL)
				{ // polyobj not located in the link cell
					continue;
				}
				link->polyobj = NULL;
			}
		}
	}
}